

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  iterator *this;
  bool bVar1;
  ostream *poVar2;
  undefined4 in_register_0000003c;
  long lVar3;
  float val;
  iterator *src [2];
  int i [5];
  double d [3];
  source<int> si;
  source<double> sd;
  float local_dc;
  undefined ***local_d8 [4];
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined **local_90;
  undefined ****local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined **local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 local_28;
  
  mtrace(CONCAT44(in_register_0000003c,param_1));
  local_50 = &local_a8;
  local_a8 = 0x3ff0000000000000;
  uStack_a0 = 0xc010000000000000;
  local_48 = 0x18;
  local_58 = &PTR_value_00104c78;
  local_40 = 0;
  uStack_38 = 0;
  local_28 = 0x6400000001;
  local_30 = 0;
  local_98 = 0x4053800000000000;
  local_88 = local_d8 + 2;
  local_d8[2] = (undefined ***)0x200000001;
  local_d8[3] = (undefined ***)0x400000003;
  local_b8 = 5;
  local_80 = 0x14;
  local_90 = &PTR_value_00104cf8;
  local_78 = 0;
  uStack_70 = 0;
  local_60 = 0x69fffffffe;
  local_68 = 4;
  local_d8[0] = &local_58;
  local_d8[1] = &local_90;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 8) {
    this = *(iterator **)((long)local_d8 + lVar3);
    while( true ) {
      bVar1 = mpt::iterator::get<float>(this,&local_dc);
      if (!bVar1) break;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_dc);
      std::endl<char,std::char_traits<char>>(poVar2);
      (*this->_vptr_iterator[1])(this);
    }
  }
  return 0;
}

Assistant:

extern int main(int , char * const [])
{
	float val;
	mtrace();
	
	const double d[] = { 1, -4, 78 };
	mpt::source<double> sd(d, 3);
	
	const int i[] = { 1, 2, 3, 4, 5 };
	mpt::source<int> si(i, 5, -2);
	
	mpt::iterator *src[] = { &sd, &si };
	
	for (mpt::iterator *it : src) {
		while (it->get(val)) {
			std::cout << val << std::endl;
			it->advance();
		}
	}
	
	return 0;
}